

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::verifyCurrentVertexAttribConversion
               (TestContext *testCtx,CallLogWrapper *gl,GLint index,GLfloat x,GLfloat y,GLfloat z,
               GLfloat w)

{
  ostringstream *this;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  StateQueryMemoryWriteGuard<int[4]> attribValue;
  StateQueryMemoryWriteGuard<int[4]> local_1e8;
  undefined1 local_1b0 [384];
  
  local_1e8.m_postguard[0] = -0x21212122;
  local_1e8.m_postguard[1] = -0x21212122;
  local_1e8.m_postguard[2] = -0x21212122;
  local_1e8.m_postguard[3] = -0x21212122;
  local_1e8.m_value[0] = -0x21212122;
  local_1e8.m_value[1] = -0x21212122;
  local_1e8.m_value[2] = -0x21212122;
  local_1e8.m_value[3] = -0x21212122;
  local_1e8.m_preguard[0] = -0x21212122;
  local_1e8.m_preguard[1] = -0x21212122;
  local_1e8.m_preguard[2] = -0x21212122;
  local_1e8.m_preguard[3] = -0x21212122;
  glu::CallLogWrapper::glGetVertexAttribiv(gl,index,0x8626,local_1e8.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity(&local_1e8,testCtx);
  fVar1 = floorf(x);
  fVar2 = floorf(y);
  fVar3 = floorf(z);
  fVar4 = floorf(w);
  fVar5 = ceilf(x);
  fVar6 = ceilf(y);
  fVar7 = ceilf(z);
  fVar8 = ceilf(w);
  if (((((int)fVar5 < local_1e8.m_value[0] || local_1e8.m_value[0] < (int)fVar1) ||
       ((int)fVar6 < local_1e8.m_value[1] || local_1e8.m_value[1] < (int)fVar2)) ||
      ((int)fVar7 < local_1e8.m_value[2] || local_1e8.m_value[2] < (int)fVar3)) ||
     ((int)fVar8 < local_1e8.m_value[3] || local_1e8.m_value[3] < (int)fVar4)) {
    local_1b0._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"// ERROR: expected in range ",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
    std::ostream::operator<<(this,(int)fVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    std::ostream::operator<<(this,(int)fVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"], ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
    std::ostream::operator<<(this,(int)fVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    std::ostream::operator<<(this,(int)fVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"], ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
    std::ostream::operator<<(this,(int)fVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    std::ostream::operator<<(this,(int)fVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"], ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
    std::ostream::operator<<(this,(int)fVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    std::ostream::operator<<(this,(int)fVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
    std::ostream::operator<<(this,local_1e8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,local_1e8.m_value[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,local_1e8.m_value[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
    std::ostream::operator<<(this,local_1e8.m_value[3]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; Input=",8);
    std::ostream::_M_insert<double>((double)x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; ",2);
    std::ostream::_M_insert<double>((double)y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; ",2);
    std::ostream::_M_insert<double>((double)z);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; ",2);
    std::ostream::_M_insert<double>((double)w);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid attribute value");
    }
  }
  return;
}

Assistant:

void verifyCurrentVertexAttribConversion (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLint index, GLfloat x, GLfloat y, GLfloat z, GLfloat w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> attribValue;
	gl.glGetVertexAttribiv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);

	attribValue.verifyValidity(testCtx);

	const GLint referenceAsGLintMin[] =
	{
		roundGLfloatToNearestIntegerDown<GLint>(x),
		roundGLfloatToNearestIntegerDown<GLint>(y),
		roundGLfloatToNearestIntegerDown<GLint>(z),
		roundGLfloatToNearestIntegerDown<GLint>(w)
	};
	const GLint referenceAsGLintMax[] =
	{
		roundGLfloatToNearestIntegerUp<GLint>(x),
		roundGLfloatToNearestIntegerUp<GLint>(y),
		roundGLfloatToNearestIntegerUp<GLint>(z),
		roundGLfloatToNearestIntegerUp<GLint>(w)
	};

	if (attribValue[0] < referenceAsGLintMin[0] || attribValue[0] > referenceAsGLintMax[0] ||
		attribValue[1] < referenceAsGLintMin[1] || attribValue[1] > referenceAsGLintMax[1] ||
		attribValue[2] < referenceAsGLintMin[2] || attribValue[2] > referenceAsGLintMax[2] ||
		attribValue[3] < referenceAsGLintMin[3] || attribValue[3] > referenceAsGLintMax[3])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in range "
			<< "[" << referenceAsGLintMin[0] << " " << referenceAsGLintMax[0] << "], "
			<< "[" << referenceAsGLintMin[1] << " " << referenceAsGLintMax[1] << "], "
			<< "[" << referenceAsGLintMin[2] << " " << referenceAsGLintMax[2] << "], "
			<< "[" << referenceAsGLintMin[3] << " " << referenceAsGLintMax[3] << "]"
			<< "; got "
			<< attribValue[0] << ", "
			<< attribValue[1] << ", "
			<< attribValue[2] << ", "
			<< attribValue[3] << " "
			<< "; Input="
			<< x << "; "
			<< y << "; "
			<< z << "; "
			<< w << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid attribute value");
	}
}